

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

int sexp_write_utf8_char(sexp ctx,int c,sexp out)

{
  sexp psVar1;
  sexp in_RDX;
  int in_ESI;
  int i;
  int len;
  uchar buf [8];
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar2;
  byte in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  int local_4;
  
  local_4 = sexp_utf8_char_byte_count(in_ESI);
  sexp_utf8_encode_char(&stack0xffffffffffffffd8,local_4,in_ESI);
  (&stack0xffffffffffffffd8)[local_4] = 0;
  if ((in_RDX->value).type.setters == (sexp)0x0) {
    iVar2 = putc((uint)in_stack_ffffffffffffffd8,(FILE *)(in_RDX->value).type.getters);
  }
  else if ((in_RDX->value).type.print < (sexp)(in_RDX->value).port.size) {
    psVar1 = (in_RDX->value).type.print;
    (in_RDX->value).type.print = (sexp)((long)&psVar1->tag + 1);
    *(byte *)((long)&psVar1->tag + (long)&((in_RDX->value).type.setters)->tag) =
         in_stack_ffffffffffffffd8;
    iVar2 = 0;
  }
  else {
    iVar2 = sexp_buffered_write_char
                      ((sexp)CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8),local_4,
                       (sexp)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if (iVar2 == -1) {
    local_4 = -1;
  }
  else if ((in_RDX->value).type.setters == (sexp)0x0) {
    fputs(&stack0xffffffffffffffd9,(FILE *)(in_RDX->value).type.getters);
  }
  else {
    sexp_buffered_write_string
              (in_RDX,(char *)CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8),
               (sexp)CONCAT44(local_4,iVar2));
  }
  return local_4;
}

Assistant:

int sexp_write_utf8_char (sexp ctx, int c, sexp out) {
  unsigned char buf[8];
  int len = sexp_utf8_char_byte_count(c), i;
  sexp_utf8_encode_char(buf, len, c);
  buf[len] = 0;
  i = sexp_write_char(ctx, buf[0], out);
  if (i == EOF) return EOF;
  sexp_write_string(ctx, (char*)buf+1, out);
  return len;
}